

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dimacs.h
# Opt level: O3

void Glucose::parse_DIMACS<Glucose::MultiSolvers>(gzFile input_stream,MultiSolvers *S)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  StreamBuffer in;
  int iVar10;
  int iVar11;
  uchar in_stack_ffffffffffefffc8;
  
  iVar2 = gzread(input_stream,&stack0xffffffffffefffc8,0x100000);
  iVar8 = 0;
  iVar10 = 0;
  iVar11 = 0;
  do {
    while( true ) {
      skipWhitespace<Glucose::StreamBuffer>((StreamBuffer *)&stack0xffffffffffefffc0);
      if (iVar2 < 1) {
        if (iVar11 != S->numvar) {
          parse_DIMACS<Glucose::MultiSolvers>();
        }
        if (iVar8 != iVar10) {
          parse_DIMACS<Glucose::MultiSolvers>();
        }
        return;
      }
      if (in_stack_ffffffffffefffc8 == 'p') break;
      if (in_stack_ffffffffffefffc8 == 'c') {
        do {
          StreamBuffer::operator++((StreamBuffer *)&stack0xffffffffffefffc0);
        } while (0 < iVar2);
      }
      else {
        iVar3 = parseInt<Glucose::StreamBuffer>((StreamBuffer *)&stack0xffffffffffefffc0);
        while (iVar3 != 0) {
          iVar7 = -iVar3;
          if (0 < iVar3) {
            iVar7 = iVar3;
          }
          while (S->numvar < iVar7) {
            MultiSolvers::newVar(S,true,true);
          }
          vec<Glucose::Lit>::push
                    ((vec<Glucose::Lit> *)&stack0xffffffffffefffa8,(Lit *)&stack0xffffffffffefffa4);
          iVar3 = parseInt<Glucose::StreamBuffer>((StreamBuffer *)&stack0xffffffffffefffc0);
        }
        iVar8 = iVar8 + 1;
        MultiSolvers::addClause_(S,(vec<Glucose::Lit> *)&stack0xffffffffffefffa8);
      }
    }
    lVar5 = 1;
    bVar9 = false;
    cVar1 = 'p';
    do {
      cVar4 = -1;
      if (0 < iVar2) {
        cVar4 = 'p';
      }
      if (cVar4 != cVar1) break;
      StreamBuffer::operator++((StreamBuffer *)&stack0xffffffffffefffc0);
      cVar1 = "p cnf"[lVar5];
      bVar9 = cVar1 == '\0';
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    if (!bVar9) {
      uVar6 = 0xffffffff;
      if (0 < iVar2) {
        uVar6 = 0x70;
      }
      printf("PARSE ERROR! Unexpected char: %c\n",uVar6);
      exit(3);
    }
    iVar11 = parseInt<Glucose::StreamBuffer>((StreamBuffer *)&stack0xffffffffffefffc0);
    iVar10 = parseInt<Glucose::StreamBuffer>((StreamBuffer *)&stack0xffffffffffefffc0);
  } while( true );
}

Assistant:

static void parse_DIMACS(gzFile input_stream, Solver& S) {
    StreamBuffer in(input_stream);
    parse_DIMACS_main(in, S); }